

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O1

string * duckdb_apache::thrift::to_string<signed_char>(string *__return_storage_ptr__,char *t)

{
  ostringstream o;
  char local_191;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_191 = *t;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_191,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& t) {
  std::ostringstream o;
  o << t;
  return o.str();
}